

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ELU_x86_avx512::forward_inplace(ELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 (*pauVar9) [64];
  long lVar10;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar25 [32];
  undefined1 auVar11 [16];
  undefined1 auVar19 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 extraout_var [60];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  float afVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  float afVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar51 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar16 [16];
  undefined1 auVar24 [32];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    auVar26 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar27 = vxorps_avx512dq(auVar26,(undefined1  [64])::_ps512_cephes_exp_C1);
    auVar26 = vxorps_avx512dq(auVar26,(undefined1  [64])::_ps512_cephes_exp_C2);
    lVar10 = 0;
    auVar28 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
    auVar11 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
    auVar51 = ZEXT1664(auVar11);
    auVar11 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
    auVar52 = ZEXT1664(auVar11);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar53 = ZEXT3264(auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar54 = ZEXT3264(auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar55 = ZEXT3264(auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar56 = ZEXT3264(auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar58 = ZEXT3264(auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar59 = ZEXT3264(auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
    auVar60 = ZEXT3264(auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar61 = ZEXT3264(auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar62 = ZEXT3264(auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar63 = ZEXT3264(auVar19);
    auVar33 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                 CONCAT424(0x3d2aa9c1,
                                           CONCAT420(0x3d2aa9c1,
                                                     CONCAT416(0x3d2aa9c1,
                                                               CONCAT412(0x3d2aa9c1,
                                                                         CONCAT48(0x3d2aa9c1,
                                                                                  0x3d2aa9c13d2aa9c1
                                                                                 )))))));
    auVar42 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                 CONCAT424(0x3e2aaaaa,
                                           CONCAT420(0x3e2aaaaa,
                                                     CONCAT416(0x3e2aaaaa,
                                                               CONCAT412(0x3e2aaaaa,
                                                                         CONCAT48(0x3e2aaaaa,
                                                                                  0x3e2aaaaa3e2aaaaa
                                                                                 )))))));
    auVar44 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar45 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
    auVar34 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
    auVar36 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
    auVar38 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    afVar39 = ::_ps512_1;
    afVar47 = ::_ps512_cephes_exp_p5;
    do {
      auVar19 = auVar33._0_32_;
      pauVar9 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * lVar10 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      auVar33 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_ELU).alpha));
      if ((int)uVar8 < 0x10) {
        uVar6 = 0;
      }
      else {
        iVar4 = 0xf;
        do {
          auVar34 = vmaxps_avx512f(*pauVar9,auVar51);
          auVar36 = vminps_avx512f(*pauVar9,auVar51);
          auVar36 = vminps_avx512f(auVar36,(undefined1  [64])::_ps512_exp_hi);
          auVar36 = vmaxps_avx512f(auVar36,(undefined1  [64])::_ps512_exp_lo);
          auVar38 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar36,
                                        (undefined1  [64])afVar47);
          auVar29 = vrndscaleps_avx512f(auVar38,1);
          uVar3 = vcmpps_avx512f(auVar38,auVar29,1);
          auVar38 = vsubps_avx512f(auVar29,(undefined1  [64])afVar39);
          bVar2 = (bool)((byte)uVar3 & 1);
          auVar30._0_4_ = (uint)bVar2 * auVar38._0_4_ | (uint)!bVar2 * auVar29._0_4_;
          bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
          auVar30._4_4_ = (uint)bVar2 * auVar38._4_4_ | (uint)!bVar2 * auVar29._4_4_;
          bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
          auVar30._8_4_ = (uint)bVar2 * auVar38._8_4_ | (uint)!bVar2 * auVar29._8_4_;
          bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
          auVar30._12_4_ = (uint)bVar2 * auVar38._12_4_ | (uint)!bVar2 * auVar29._12_4_;
          bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
          auVar30._16_4_ = (uint)bVar2 * auVar38._16_4_ | (uint)!bVar2 * auVar29._16_4_;
          bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
          auVar30._20_4_ = (uint)bVar2 * auVar38._20_4_ | (uint)!bVar2 * auVar29._20_4_;
          bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
          auVar30._24_4_ = (uint)bVar2 * auVar38._24_4_ | (uint)!bVar2 * auVar29._24_4_;
          bVar2 = (bool)((byte)(uVar3 >> 7) & 1);
          auVar30._28_4_ = (uint)bVar2 * auVar38._28_4_ | (uint)!bVar2 * auVar29._28_4_;
          bVar2 = (bool)((byte)(uVar3 >> 8) & 1);
          auVar30._32_4_ = (uint)bVar2 * auVar38._32_4_ | (uint)!bVar2 * auVar29._32_4_;
          bVar2 = (bool)((byte)(uVar3 >> 9) & 1);
          auVar30._36_4_ = (uint)bVar2 * auVar38._36_4_ | (uint)!bVar2 * auVar29._36_4_;
          bVar2 = (bool)((byte)(uVar3 >> 10) & 1);
          auVar30._40_4_ = (uint)bVar2 * auVar38._40_4_ | (uint)!bVar2 * auVar29._40_4_;
          bVar2 = (bool)((byte)(uVar3 >> 0xb) & 1);
          auVar30._44_4_ = (uint)bVar2 * auVar38._44_4_ | (uint)!bVar2 * auVar29._44_4_;
          bVar2 = (bool)((byte)(uVar3 >> 0xc) & 1);
          auVar30._48_4_ = (uint)bVar2 * auVar38._48_4_ | (uint)!bVar2 * auVar29._48_4_;
          bVar2 = (bool)((byte)(uVar3 >> 0xd) & 1);
          auVar30._52_4_ = (uint)bVar2 * auVar38._52_4_ | (uint)!bVar2 * auVar29._52_4_;
          bVar2 = (bool)((byte)(uVar3 >> 0xe) & 1);
          auVar30._56_4_ = (uint)bVar2 * auVar38._56_4_ | (uint)!bVar2 * auVar29._56_4_;
          bVar2 = SUB81(uVar3 >> 0xf,0);
          auVar30._60_4_ = (uint)bVar2 * auVar38._60_4_ | (uint)!bVar2 * auVar29._60_4_;
          auVar36 = vfmadd231ps_avx512f(auVar36,auVar30,auVar27);
          auVar36 = vfmadd231ps_avx512f(auVar36,auVar30,auVar26);
          auVar38 = vmulps_avx512f(auVar36,auVar36);
          auVar29 = vfmadd132ps_avx512f(auVar36,(undefined1  [64])::_ps512_cephes_exp_p1,
                                        (undefined1  [64])::_ps512_cephes_exp_p0);
          auVar29 = vfmadd213ps_avx512f(auVar29,auVar36,(undefined1  [64])::_ps512_cephes_exp_p2);
          auVar29 = vfmadd213ps_avx512f(auVar29,auVar36,(undefined1  [64])::_ps512_cephes_exp_p3);
          auVar29 = vfmadd213ps_avx512f(auVar29,auVar36,(undefined1  [64])::_ps512_cephes_exp_p4);
          auVar29 = vfmadd213ps_avx512f(auVar29,auVar36,(undefined1  [64])afVar47);
          auVar36 = vfmadd213ps_avx512f(auVar29,auVar38,auVar36);
          auVar36 = vaddps_avx512f(auVar36,(undefined1  [64])afVar39);
          auVar38 = vcvttps2dq_avx512f(auVar30);
          auVar38 = vpaddd_avx512f(auVar38,(undefined1  [64])::_pi32_512_0x7f);
          auVar38 = vpslld_avx512f(auVar38,0x17);
          auVar36 = vfmadd213ps_avx512f(auVar38,auVar36,auVar28);
          auVar34 = vfmadd213ps_avx512f(auVar36,auVar33,auVar34);
          *pauVar9 = auVar34;
          pauVar9 = pauVar9 + 1;
          iVar4 = iVar4 + 0x10;
        } while (iVar4 < (int)uVar8);
        auVar33 = ZEXT464((uint)(this->super_ELU).alpha);
        auVar19._8_4_ = 0x3d2aa9c1;
        auVar19._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar19._12_4_ = 0x3d2aa9c1;
        auVar19._16_4_ = 0x3d2aa9c1;
        auVar19._20_4_ = 0x3d2aa9c1;
        auVar19._24_4_ = 0x3d2aa9c1;
        auVar19._28_4_ = 0x3d2aa9c1;
        auVar34 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar36 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar38 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        uVar6 = uVar8 & 0xfffffff0;
      }
      auVar32._0_4_ = auVar33._0_4_;
      if ((int)(uVar6 | 7) < (int)uVar8) {
        auVar32._4_4_ = auVar32._0_4_;
        auVar32._8_4_ = auVar32._0_4_;
        auVar32._12_4_ = auVar32._0_4_;
        auVar32._16_4_ = auVar32._0_4_;
        auVar32._20_4_ = auVar32._0_4_;
        auVar32._24_4_ = auVar32._0_4_;
        auVar32._28_4_ = auVar32._0_4_;
        uVar5 = uVar6;
        do {
          auVar20 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar9,auVar52._0_32_);
          auVar21 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar9,auVar52._0_32_);
          auVar21 = vminps_avx512vl(auVar21,auVar53._0_32_);
          auVar22 = vmaxps_avx512vl(auVar21,auVar54._0_32_);
          auVar23 = vfmadd231ps_avx512vl(auVar55._0_32_,auVar22,auVar56._0_32_);
          auVar21 = vroundps_avx(auVar23,1);
          uVar3 = vcmpps_avx512vl(auVar23,auVar21,1);
          auVar57 = auVar58._0_32_;
          auVar24 = vsubps_avx512vl(auVar21,auVar57);
          bVar2 = (bool)((byte)uVar3 & 1);
          auVar25._0_4_ = (float)((uint)bVar2 * auVar24._0_4_ | (uint)!bVar2 * auVar21._0_4_);
          bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
          auVar25._4_4_ = (float)((uint)bVar2 * auVar24._4_4_ | (uint)!bVar2 * auVar21._4_4_);
          bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
          auVar25._8_4_ = (float)((uint)bVar2 * auVar24._8_4_ | (uint)!bVar2 * auVar21._8_4_);
          bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
          auVar25._12_4_ = (float)((uint)bVar2 * auVar24._12_4_ | (uint)!bVar2 * auVar21._12_4_);
          bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
          auVar25._16_4_ = (float)((uint)bVar2 * auVar24._16_4_ | (uint)!bVar2 * auVar21._16_4_);
          bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
          auVar25._20_4_ = (float)((uint)bVar2 * auVar24._20_4_ | (uint)!bVar2 * auVar21._20_4_);
          bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
          auVar25._24_4_ = (float)((uint)bVar2 * auVar24._24_4_ | (uint)!bVar2 * auVar21._24_4_);
          bVar2 = SUB81(uVar3 >> 7,0);
          auVar25._28_4_ = (float)((uint)bVar2 * auVar24._28_4_ | (uint)!bVar2 * auVar21._28_4_);
          auVar21 = vfmsub231ps_avx512vl(auVar22,auVar25,auVar59._0_32_);
          auVar22 = vfmsub231ps_avx512vl(auVar21,auVar25,auVar60._0_32_);
          auVar21._4_4_ = auVar22._4_4_ * auVar22._4_4_;
          auVar21._0_4_ = auVar22._0_4_ * auVar22._0_4_;
          auVar21._8_4_ = auVar22._8_4_ * auVar22._8_4_;
          auVar21._12_4_ = auVar22._12_4_ * auVar22._12_4_;
          auVar21._16_4_ = auVar22._16_4_ * auVar22._16_4_;
          auVar21._20_4_ = auVar22._20_4_ * auVar22._20_4_;
          auVar21._24_4_ = auVar22._24_4_ * auVar22._24_4_;
          auVar21._28_4_ = auVar23._28_4_;
          auVar23 = vfmadd213ps_avx512vl(auVar61._0_32_,auVar22,auVar62._0_32_);
          auVar23 = vfmadd213ps_avx512vl(auVar23,auVar22,auVar63._0_32_);
          auVar11 = vfmadd213ps_fma(auVar23,auVar22,auVar19);
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar11),auVar22,auVar42._0_32_);
          auVar23 = vfmadd213ps_avx512vl(ZEXT1632(auVar11),auVar22,auVar55._0_32_);
          auVar11 = vfmadd213ps_fma(auVar23,auVar21,auVar22);
          auVar22 = vaddps_avx512vl(ZEXT1632(auVar11),auVar57);
          auVar23._0_4_ = (int)auVar25._0_4_;
          auVar23._4_4_ = (int)auVar25._4_4_;
          auVar23._8_4_ = (int)auVar25._8_4_;
          auVar23._12_4_ = (int)auVar25._12_4_;
          auVar23._16_4_ = (int)auVar25._16_4_;
          auVar23._20_4_ = (int)auVar25._20_4_;
          auVar23._24_4_ = (int)auVar25._24_4_;
          auVar23._28_4_ = (int)auVar25._28_4_;
          auVar21 = vpslld_avx2(auVar23,0x17);
          auVar21 = vpaddd_avx2(auVar44._0_32_,auVar21);
          auVar21 = vfmsub213ps_avx512vl(auVar21,auVar22,auVar57);
          auVar11 = vfmadd213ps_fma(auVar21,auVar32,auVar20);
          *(undefined1 (*) [32])*pauVar9 = ZEXT1632(auVar11);
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
          uVar6 = uVar5 + 8;
          iVar4 = uVar5 + 0xf;
          uVar5 = uVar6;
        } while (iVar4 < (int)uVar8);
        auVar32._0_4_ = (this->super_ELU).alpha;
        auVar45 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar34 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar36 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar38 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      }
      if ((int)(uVar6 | 3) < (int)uVar8) {
        auVar31._4_4_ = auVar32._0_4_;
        auVar31._0_4_ = auVar32._0_4_;
        auVar31._8_4_ = auVar32._0_4_;
        auVar31._12_4_ = auVar32._0_4_;
        auVar43._8_4_ = 0x3f000000;
        auVar43._0_8_ = 0x3f0000003f000000;
        auVar43._12_4_ = 0x3f000000;
        auVar41._8_4_ = 0x3f318000;
        auVar41._0_8_ = 0x3f3180003f318000;
        auVar41._12_4_ = 0x3f318000;
        auVar40._8_4_ = 0x395e8083;
        auVar40._0_8_ = 0x395e8083395e8083;
        auVar40._12_4_ = 0x395e8083;
        auVar11 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar46._8_4_ = 0x3ab743ce;
        auVar46._0_8_ = 0x3ab743ce3ab743ce;
        auVar46._12_4_ = 0x3ab743ce;
        auVar48._8_4_ = 0x3c088908;
        auVar48._0_8_ = 0x3c0889083c088908;
        auVar48._12_4_ = 0x3c088908;
        auVar49._8_4_ = 0x3d2aa9c1;
        auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar49._12_4_ = 0x3d2aa9c1;
        auVar12 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar13 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar13);
        auVar50._8_4_ = 0x3f800000;
        auVar50._0_8_ = 0x3f8000003f800000;
        auVar50._12_4_ = 0x3f800000;
        uVar5 = uVar6;
        do {
          auVar14 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar9,auVar13);
          auVar15 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar9,auVar13);
          auVar15 = vminps_avx(auVar45._0_16_,auVar15);
          auVar18 = vmaxps_avx(auVar15,auVar34._0_16_);
          auVar17 = vfmadd231ps_fma(auVar43,auVar18,auVar36._0_16_);
          auVar35._0_4_ = (int)auVar17._0_4_;
          auVar35._4_4_ = (int)auVar17._4_4_;
          auVar35._8_4_ = (int)auVar17._8_4_;
          auVar35._12_4_ = (int)auVar17._12_4_;
          auVar15 = vcvtdq2ps_avx(auVar35);
          uVar3 = vcmpps_avx512vl(auVar17,auVar15,1);
          auVar16 = vsubps_avx512vl(auVar15,auVar38._0_16_);
          bVar2 = (bool)((byte)uVar3 & 1);
          auVar17._0_4_ = (float)((uint)bVar2 * auVar16._0_4_ | (uint)!bVar2 * auVar15._0_4_);
          bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
          auVar17._4_4_ = (float)((uint)bVar2 * auVar16._4_4_ | (uint)!bVar2 * auVar15._4_4_);
          bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
          auVar17._8_4_ = (float)((uint)bVar2 * auVar16._8_4_ | (uint)!bVar2 * auVar15._8_4_);
          bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
          auVar17._12_4_ = (float)((uint)bVar2 * auVar16._12_4_ | (uint)!bVar2 * auVar15._12_4_);
          auVar15 = vfmsub231ps_fma(auVar18,auVar17,auVar41);
          auVar18 = vfmsub231ps_fma(auVar15,auVar17,auVar40);
          auVar16._0_4_ = auVar18._0_4_ * auVar18._0_4_;
          auVar16._4_4_ = auVar18._4_4_ * auVar18._4_4_;
          auVar16._8_4_ = auVar18._8_4_ * auVar18._8_4_;
          auVar16._12_4_ = auVar18._12_4_ * auVar18._12_4_;
          auVar15 = vfmadd213ps_fma(auVar11,auVar18,auVar46);
          auVar15 = vfmadd213ps_fma(auVar15,auVar18,auVar48);
          auVar15 = vfmadd213ps_fma(auVar15,auVar18,auVar49);
          auVar15 = vfmadd213ps_avx512vl(auVar15,auVar18,auVar12);
          auVar15 = vfmadd213ps_fma(auVar15,auVar18,auVar43);
          auVar15 = vfmadd213ps_fma(auVar15,auVar16,auVar18);
          auVar18._8_4_ = 0x3f800000;
          auVar18._0_8_ = 0x3f8000003f800000;
          auVar18._12_4_ = 0x3f800000;
          auVar18 = vaddps_avx512vl(auVar15,auVar18);
          auVar37._8_4_ = 0x3f800000;
          auVar37._0_8_ = 0x3f8000003f800000;
          auVar37._12_4_ = 0x3f800000;
          auVar38 = ZEXT1664(auVar37);
          auVar15._0_4_ = (int)auVar17._0_4_;
          auVar15._4_4_ = (int)auVar17._4_4_;
          auVar15._8_4_ = (int)auVar17._8_4_;
          auVar15._12_4_ = (int)auVar17._12_4_;
          auVar36 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
          auVar15 = vpslld_avx(auVar15,0x17);
          auVar15 = vpaddd_avx(auVar50,auVar15);
          auVar15 = vfmsub213ps_fma(auVar15,auVar18,auVar37);
          auVar15 = vfmadd213ps_fma(auVar15,auVar31,auVar14);
          *(undefined1 (*) [16])*pauVar9 = auVar15;
          auVar34 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
          uVar6 = uVar5 + 4;
          iVar4 = uVar5 + 7;
          uVar5 = uVar6;
        } while (iVar4 < (int)uVar8);
      }
      auVar33 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                   CONCAT424(0x3d2aa9c1,
                                             CONCAT420(0x3d2aa9c1,
                                                       CONCAT416(0x3d2aa9c1,
                                                                 CONCAT412(0x3d2aa9c1,
                                                                           CONCAT48(0x3d2aa9c1,
                                                                                                                                                                        
                                                  0x3d2aa9c13d2aa9c1)))))));
      auVar42 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                   CONCAT424(0x3e2aaaaa,
                                             CONCAT420(0x3e2aaaaa,
                                                       CONCAT416(0x3e2aaaaa,
                                                                 CONCAT412(0x3e2aaaaa,
                                                                           CONCAT48(0x3e2aaaaa,
                                                                                                                                                                        
                                                  0x3e2aaaaa3e2aaaaa)))))));
      auVar44 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      if (uVar8 - uVar6 != 0 && (int)uVar6 <= (int)uVar8) {
        lVar7 = 0;
        do {
          auVar11 = auVar51._0_16_;
          auVar12 = auVar52._0_16_;
          if (*(float *)(*pauVar9 + lVar7 * 4) < 0.0) {
            auVar32._0_4_ = (this->super_ELU).alpha;
            auVar29._0_4_ = expf(*(float *)(*pauVar9 + lVar7 * 4));
            afVar47 = ::_ps512_cephes_exp_p5;
            afVar39 = ::_ps512_1;
            auVar29._4_60_ = extraout_var;
            auVar38 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar36 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
            auVar34 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
            auVar45 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
            auVar44 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            auVar42 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar33 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                         CONCAT424(0x3d2aa9c1,
                                                   CONCAT420(0x3d2aa9c1,
                                                             CONCAT416(0x3d2aa9c1,
                                                                       CONCAT412(0x3d2aa9c1,
                                                                                 CONCAT48(0x3d2aa9c1
                                                                                          ,
                                                  0x3d2aa9c13d2aa9c1)))))));
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar63 = ZEXT3264(auVar19);
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar62 = ZEXT3264(auVar19);
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar61 = ZEXT3264(auVar19);
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
            auVar60 = ZEXT3264(auVar19);
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar59 = ZEXT3264(auVar19);
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar58 = ZEXT3264(auVar19);
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
            auVar56 = ZEXT3264(auVar19);
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar55 = ZEXT3264(auVar19);
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar54 = ZEXT3264(auVar19);
            auVar19 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
            auVar53 = ZEXT3264(auVar19);
            auVar12 = vxorps_avx512vl(auVar12,auVar12);
            auVar52 = ZEXT1664(auVar12);
            auVar11 = vxorps_avx512vl(auVar11,auVar11);
            auVar51 = ZEXT1664(auVar11);
            auVar28 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
            auVar11 = ZEXT416((uint)auVar32._0_4_);
            auVar11 = vfmsub213ss_fma(auVar29._0_16_,auVar11,auVar11);
            *(int *)(*pauVar9 + lVar7 * 4) = auVar11._0_4_;
          }
          lVar7 = lVar7 + 1;
        } while (uVar8 - uVar6 != (int)lVar7);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar1);
  }
  return 0;
}

Assistant:

int ELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}